

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

QPDFObjectHandle __thiscall
QPDF::readObjectAtOffset
          (QPDF *this,bool try_recovery,qpdf_offset_t offset,string *description,QPDFObjGen exp_og,
          QPDFObjGen *og,bool skip_cache_if_in_xref)

{
  byte bVar1;
  pointer pcVar2;
  QPDFObjGen og_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  int iVar5;
  long *plVar6;
  qpdf_offset_t qVar7;
  long lVar8;
  qpdf_offset_t end_after_space;
  const_iterator cVar9;
  QPDFExc *pQVar10;
  long *plVar11;
  size_type *psVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  undefined7 in_register_00000031;
  string *description_00;
  bool bVar14;
  QPDFObjectHandle QVar15;
  undefined7 in_stack_00000009;
  char in_stack_00000010;
  QPDFObjGen exp_og_local;
  string local_248;
  QPDFExc e;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  Token tobjid;
  string local_120;
  Token tgen;
  Token tobj;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  
  description_00 = (string *)CONCAT71(in_register_00000031,try_recovery);
  exp_og_local = (QPDFObjGen)og;
  setLastObjectDescription((QPDF *)description_00,(string *)exp_og,(QPDFObjGen)og);
  if (description == (string *)0x0) {
    psVar13 = &tobjid.value._M_string_length;
    tobjid._0_8_ = psVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&tobjid,"object has offset 0","");
    damagedPDF(&e,(QPDF *)description_00,-1,(string *)&tobjid);
    warn((QPDF *)description_00,&e);
    QPDFExc::~QPDFExc(&e);
    if ((size_type *)tobjid._0_8_ != psVar13) {
      operator_delete((void *)tobjid._0_8_,tobjid.value._M_string_length + 1);
    }
    QVar15 = QPDFObjectHandle::newNull();
    _Var12._M_pi = QVar15.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    pcVar2 = (description_00->_M_dataplus)._M_p;
    bVar1 = pcVar2[0x100];
    plVar6 = *(long **)(pcVar2 + 0xb0);
    (**(code **)(*plVar6 + 0x28))(plVar6,description,0);
    pcVar2 = (description_00->_M_dataplus)._M_p;
    ::qpdf::Tokenizer::readToken
              (&tobjid,(Tokenizer *)(pcVar2 + 0x18),*(InputSource **)(pcVar2 + 0xb0),
               (string *)(pcVar2 + 0xc0),true,0);
    if (tobjid.type != tt_integer) {
      pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
      e._0_8_ = &e.error_code;
      std::__cxx11::string::_M_construct<char_const*>((string *)&e,"expected n n obj","");
      damagedPDF(pQVar10,(QPDF *)description_00,(qpdf_offset_t)description,(string *)&e);
      __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    pcVar2 = (description_00->_M_dataplus)._M_p;
    ::qpdf::Tokenizer::readToken
              (&tgen,(Tokenizer *)(pcVar2 + 0x18),*(InputSource **)(pcVar2 + 0xb0),
               (string *)(pcVar2 + 0xc0),true,0);
    if (tgen.type != tt_integer) {
      pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
      e._0_8_ = &e.error_code;
      std::__cxx11::string::_M_construct<char_const*>((string *)&e,"expected n n obj","");
      damagedPDF(pQVar10,(QPDF *)description_00,(qpdf_offset_t)description,(string *)&e);
      __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    pcVar2 = (description_00->_M_dataplus)._M_p;
    ::qpdf::Tokenizer::readToken
              (&tobj,(Tokenizer *)(pcVar2 + 0x18),*(InputSource **)(pcVar2 + 0xb0),
               (string *)(pcVar2 + 0xc0),true,0);
    e._0_8_ = &e.error_code;
    std::__cxx11::string::_M_construct<char_const*>((string *)&e,"obj","");
    if ((tobj.type == tt_word) && (tobj.value._M_string_length == e._8_8_)) {
      if (tobj.value._M_string_length == 0) {
        bVar14 = true;
      }
      else {
        iVar4 = bcmp(tobj.value._M_dataplus._M_p,(void *)e._0_8_,tobj.value._M_string_length);
        bVar14 = iVar4 == 0;
      }
    }
    else {
      bVar14 = false;
    }
    if ((qpdf_error_code_e *)e._0_8_ != &e.error_code) {
      operator_delete((void *)e._0_8_,e._16_8_ + 1);
    }
    if (!bVar14) {
      pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
      e._0_8_ = &e.error_code;
      std::__cxx11::string::_M_construct<char_const*>((string *)&e,"expected n n obj","");
      damagedPDF(pQVar10,(QPDF *)description_00,(qpdf_offset_t)description,(string *)&e);
      __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    iVar4 = QUtil::string_to_int(tobjid.value._M_dataplus._M_p);
    iVar5 = QUtil::string_to_int(tgen.value._M_dataplus._M_p);
    *(ulong *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref) = CONCAT44(iVar5,iVar4);
    if (iVar4 == 0) {
      pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
      e._0_8_ = &e.error_code;
      std::__cxx11::string::_M_construct<char_const*>((string *)&e,"object with ID 0","");
      damagedPDF(pQVar10,(QPDF *)description_00,(qpdf_offset_t)description,(string *)&e);
      __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    if (((int)og != 0) &&
       ((exp_og_local.obj != *(int *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref) ||
        (exp_og_local.gen != *(int *)(CONCAT71(in_stack_00000009,skip_cache_if_in_xref) + 4))))) {
      QPDFObjGen::unparse_abi_cxx11_(&local_120,&exp_og_local,' ');
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x27e93a);
      plVar11 = plVar6 + 2;
      if ((long *)*plVar6 == plVar11) {
        local_198 = *plVar11;
        lStack_190 = plVar6[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar11;
        local_1a8 = (long *)*plVar6;
      }
      local_1a0 = plVar6[1];
      *plVar6 = (long)plVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a8);
      psVar13 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_248.field_2._M_allocated_capacity = *psVar13;
        local_248.field_2._8_8_ = plVar6[3];
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      }
      else {
        local_248.field_2._M_allocated_capacity = *psVar13;
        local_248._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_248._M_string_length = plVar6[1];
      *plVar6 = (long)psVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      damagedPDF(&e,(QPDF *)description_00,(qpdf_offset_t)description,&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if (((int)og != 0 & (byte)offset & bVar1) != 0) {
        pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
        QPDFExc::QPDFExc(pQVar10,&e);
        __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      warn((QPDF *)description_00,&e);
      QPDFExc::~QPDFExc(&e);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tobj.error_message._M_dataplus._M_p != &tobj.error_message.field_2) {
      operator_delete(tobj.error_message._M_dataplus._M_p,
                      tobj.error_message.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tobj.raw_value._M_dataplus._M_p != &tobj.raw_value.field_2) {
      operator_delete(tobj.raw_value._M_dataplus._M_p,
                      tobj.raw_value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tobj.value._M_dataplus._M_p != &tobj.value.field_2) {
      operator_delete(tobj.value._M_dataplus._M_p,tobj.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tgen.error_message._M_dataplus._M_p != &tgen.error_message.field_2) {
      operator_delete(tgen.error_message._M_dataplus._M_p,
                      tgen.error_message.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tgen.raw_value._M_dataplus._M_p != &tgen.raw_value.field_2) {
      operator_delete(tgen.raw_value._M_dataplus._M_p,
                      tgen.raw_value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tgen.value._M_dataplus._M_p != &tgen.value.field_2) {
      operator_delete(tgen.value._M_dataplus._M_p,tgen.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tobjid.error_message._M_dataplus._M_p != &tobjid.error_message.field_2) {
      operator_delete(tobjid.error_message._M_dataplus._M_p,
                      tobjid.error_message.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tobjid.raw_value._M_dataplus._M_p != &tobjid.raw_value.field_2) {
      operator_delete(tobjid.raw_value._M_dataplus._M_p,
                      tobjid.raw_value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tobjid.value._M_dataplus._M_p != &tobjid.value.field_2) {
      operator_delete(tobjid.value._M_dataplus._M_p,tobjid.value.field_2._M_allocated_capacity + 1);
    }
    readObject(this,description_00,exp_og);
    bVar14 = isUnresolved((QPDF *)description_00,
                          *(QPDFObjGen *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref));
    _Var12._M_pi = extraout_RDX;
    if (bVar14) {
      qVar7 = (**(code **)(**(long **)((description_00->_M_dataplus)._M_p + 0xb0) + 0x20))();
      do {
        plVar6 = *(long **)((description_00->_M_dataplus)._M_p + 0xb0);
        lVar8 = (**(code **)(*plVar6 + 0x38))(plVar6,&tobjid,1);
        if (lVar8 == 0) {
          pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
          qVar7 = (**(code **)(**(long **)((description_00->_M_dataplus)._M_p + 0xb0) + 0x20))();
          e._0_8_ = &e.error_code;
          std::__cxx11::string::_M_construct<char_const*>((string *)&e,"EOF after endobj","");
          damagedPDF(pQVar10,(QPDF *)description_00,qVar7,(string *)&e);
          __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        iVar4 = isspace((uint)(byte)(undefined1)tobjid.type);
      } while (iVar4 != 0);
      plVar6 = *(long **)((description_00->_M_dataplus)._M_p + 0xb0);
      (**(code **)(*plVar6 + 0x28))(plVar6,0xffffffffffffffff,1);
      end_after_space =
           (**(code **)(**(long **)((description_00->_M_dataplus)._M_p + 0xb0) + 0x20))();
      if ((in_stack_00000010 == '\0') ||
         (pcVar2 = (description_00->_M_dataplus)._M_p,
         cVar9 = std::
                 _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                 ::find((_Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                         *)(pcVar2 + 0x138),
                        (key_type *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref)),
         _Var12._M_pi = extraout_RDX_00, cVar9._M_node == (_Base_ptr)(pcVar2 + 0x140))) {
        og_00 = *(QPDFObjGen *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref);
        e._0_8_ = (this->m)._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        e._8_8_ = this[1].m._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        if ((Members *)e._8_8_ != (Members *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&((Members *)e._8_8_)->log + 8);
            *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
            UNLOCK();
          }
          else {
            p_Var3 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&((Members *)e._8_8_)->log + 8);
            *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
          }
        }
        updateCache((QPDF *)description_00,og_00,(shared_ptr<QPDFObject> *)&e,qVar7,end_after_space,
                    true);
        _Var12._M_pi = extraout_RDX_01;
        if (e._8_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)e._8_8_);
          _Var12._M_pi = extraout_RDX_02;
        }
      }
    }
  }
  QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var12._M_pi;
  QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::readObjectAtOffset(
    bool try_recovery,
    qpdf_offset_t offset,
    std::string const& description,
    QPDFObjGen exp_og,
    QPDFObjGen& og,
    bool skip_cache_if_in_xref)
{
    bool check_og = true;
    if (exp_og.getObj() == 0) {
        // This method uses an expect object ID of 0 to indicate that we don't know or don't care
        // what the actual object ID is at this offset. This is true when we read the xref stream
        // and linearization hint streams. In this case, we don't verify the expect object
        // ID/generation against what was read from the file. There is also no reason to attempt
        // xref recovery if we get a failure in this case since the read attempt was not triggered
        // by an xref lookup.
        check_og = false;
        try_recovery = false;
    }
    setLastObjectDescription(description, exp_og);

    if (!m->attempt_recovery) {
        try_recovery = false;
    }

    // Special case: if offset is 0, just return null.  Some PDF writers, in particular
    // "Mac OS X 10.7.5 Quartz PDFContext", may store deleted objects in the xref table as
    // "0000000000 00000 n", which is not correct, but it won't hurt anything for us to ignore
    // these.
    if (offset == 0) {
        QTC::TC("qpdf", "QPDF bogus 0 offset", 0);
        warn(damagedPDF(-1, "object has offset 0"));
        return QPDFObjectHandle::newNull();
    }

    m->file->seek(offset, SEEK_SET);
    try {
        QPDFTokenizer::Token tobjid = readToken(*m->file);
        bool objidok = tobjid.isInteger();
        QTC::TC("qpdf", "QPDF check objid", objidok ? 1 : 0);
        if (!objidok) {
            QTC::TC("qpdf", "QPDF expected n n obj");
            throw damagedPDF(offset, "expected n n obj");
        }
        QPDFTokenizer::Token tgen = readToken(*m->file);
        bool genok = tgen.isInteger();
        QTC::TC("qpdf", "QPDF check generation", genok ? 1 : 0);
        if (!genok) {
            throw damagedPDF(offset, "expected n n obj");
        }
        QPDFTokenizer::Token tobj = readToken(*m->file);

        bool objok = tobj.isWord("obj");
        QTC::TC("qpdf", "QPDF check obj", objok ? 1 : 0);

        if (!objok) {
            throw damagedPDF(offset, "expected n n obj");
        }
        int objid = QUtil::string_to_int(tobjid.getValue().c_str());
        int generation = QUtil::string_to_int(tgen.getValue().c_str());
        og = QPDFObjGen(objid, generation);
        if (objid == 0) {
            QTC::TC("qpdf", "QPDF object id 0");
            throw damagedPDF(offset, "object with ID 0");
        }
        if (check_og && (exp_og != og)) {
            QTC::TC("qpdf", "QPDF err wrong objid/generation");
            QPDFExc e = damagedPDF(offset, "expected " + exp_og.unparse(' ') + " obj");
            if (try_recovery) {
                // Will be retried below
                throw e;
            } else {
                // We can try reading the object anyway even if the ID doesn't match.
                warn(e);
            }
        }
    } catch (QPDFExc& e) {
        if (try_recovery) {
            // Try again after reconstructing xref table
            reconstruct_xref(e);
            if (m->xref_table.count(exp_og) && (m->xref_table[exp_og].getType() == 1)) {
                qpdf_offset_t new_offset = m->xref_table[exp_og].getOffset();
                QPDFObjectHandle result =
                    readObjectAtOffset(false, new_offset, description, exp_og, og, false);
                QTC::TC("qpdf", "QPDF recovered in readObjectAtOffset");
                return result;
            } else {
                QTC::TC("qpdf", "QPDF object gone after xref reconstruction");
                warn(damagedPDF(
                    "",
                    -1,
                    ("object " + exp_og.unparse(' ') +
                     " not found in file after regenerating cross reference "
                     "table")));
                return QPDFObjectHandle::newNull();
            }
        } else {
            throw;
        }
    }

    QPDFObjectHandle oh = readObject(description, og);

    if (isUnresolved(og)) {
        // Store the object in the cache here so it gets cached whether we first know the offset or
        // whether we first know the object ID and generation (in which we case we would get here
        // through resolve).

        // Determine the end offset of this object before and after white space.  We use these
        // numbers to validate linearization hint tables.  Offsets and lengths of objects may imply
        // the end of an object to be anywhere between these values.
        qpdf_offset_t end_before_space = m->file->tell();

        // skip over spaces
        while (true) {
            char ch;
            if (m->file->read(&ch, 1)) {
                if (!isspace(static_cast<unsigned char>(ch))) {
                    m->file->seek(-1, SEEK_CUR);
                    break;
                }
            } else {
                throw damagedPDF(m->file->tell(), "EOF after endobj");
            }
        }
        qpdf_offset_t end_after_space = m->file->tell();
        if (skip_cache_if_in_xref && m->xref_table.count(og)) {
            // Ordinarily, an object gets read here when resolved through xref table or stream. In
            // the special case of the xref stream and linearization hint tables, the offset comes
            // from another source. For the specific case of xref streams, the xref stream is read
            // and loaded into the object cache very early in parsing. Ordinarily, when a file is
            // updated by appending, items inserted into the xref table in later updates take
            // precedence over earlier items. In the special case of reusing the object number
            // previously used as the xref stream, we have the following order of events:
            //
            // * reused object gets loaded into the xref table
            // * old object is read here while reading xref streams
            // * original xref entry is ignored (since already in xref table)
            //
            // It is the second step that causes a problem. Even though the xref table is correct in
            // this case, the old object is already in the cache and so effectively prevails over
            // the reused object. To work around this issue, we have a special case for the xref
            // stream (via the skip_cache_if_in_xref): if the object is already in the xref stream,
            // don't cache what we read here.
            //
            // It is likely that the same bug may exist for linearization hint tables, but the
            // existing code uses end_before_space and end_after_space from the cache, so fixing
            // that would require more significant rework. The chances of a linearization hint
            // stream being reused seems smaller because the xref stream is probably the highest
            // object in the file and the linearization hint stream would be some random place in
            // the middle, so I'm leaving that bug unfixed for now. If the bug were to be fixed, we
            // could use !check_og in place of skip_cache_if_in_xref.
            QTC::TC("qpdf", "QPDF skipping cache for known unchecked object");
        } else {
            updateCache(og, oh.getObj(), end_before_space, end_after_space);
        }
    }

    return oh;
}